

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool DownSizeUINT(ON__UINT64 u64,ON__UINT32 *u32)

{
  ON__UINT32 *u32_local;
  ON__UINT64 u64_local;
  
  if (0xffffffff < u64) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0xfc,"","u64 too big to convert to 4 byte unsigned int");
    *u32 = 0;
  }
  else {
    *u32 = (ON__UINT32)u64;
  }
  u64_local._7_1_ = 0xffffffff >= u64;
  return u64_local._7_1_;
}

Assistant:

static
bool DownSizeUINT( ON__UINT64 u64, ON__UINT32* u32 )
{
  if ( u64 <= 0xFFFFFFFF )
  {
    *u32 = (ON__UINT32)u64;
    return true;
  }

  ON_ERROR("u64 too big to convert to 4 byte unsigned int");
  *u32 = 0;
  return false;
}